

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSpatialAlgebra.h
# Opt level: O2

void __thiscall
btSpatialTransformationMatrix::transformInverse<btSpatialForceVector>
          (btSpatialTransformationMatrix *this,btSpatialForceVector *inVec,
          btSpatialForceVector *outVec,eOutputOperation outOp)

{
  btVector3 bVar1;
  btVector3 local_90;
  btVector3 local_80;
  btVector3 local_70;
  btMatrix3x3 local_60;
  
  if (outOp == Subtract) {
    btMatrix3x3::transpose(&local_60,&this->m_rotMat);
    local_90 = operator*(&local_60,&inVec->m_topVec);
    btVector3::operator-=(&outVec->m_topVec,&local_90);
    btMatrix3x3::transpose(&local_60,&this->m_rotMat);
    local_70 = btVector3::cross(&this->m_trnVec,&inVec->m_topVec);
    local_80 = operator+(&inVec->m_bottomVec,&local_70);
    local_90 = operator*(&local_60,&local_80);
    btVector3::operator-=(&outVec->m_bottomVec,&local_90);
  }
  else if (outOp == Add) {
    btMatrix3x3::transpose(&local_60,&this->m_rotMat);
    local_90 = operator*(&local_60,&inVec->m_topVec);
    btVector3::operator+=(&outVec->m_topVec,&local_90);
    btMatrix3x3::transpose(&local_60,&this->m_rotMat);
    local_70 = btVector3::cross(&this->m_trnVec,&inVec->m_topVec);
    local_80 = operator+(&inVec->m_bottomVec,&local_70);
    local_90 = operator*(&local_60,&local_80);
    btVector3::operator+=(&outVec->m_bottomVec,&local_90);
  }
  else if (outOp == None) {
    btMatrix3x3::transpose(&local_60,&this->m_rotMat);
    bVar1 = operator*(&local_60,&inVec->m_topVec);
    *&(outVec->m_topVec).m_floats = bVar1.m_floats;
    btMatrix3x3::transpose(&local_60,&this->m_rotMat);
    local_80 = btVector3::cross(&this->m_trnVec,&inVec->m_topVec);
    local_90 = operator+(&inVec->m_bottomVec,&local_80);
    bVar1 = operator*(&local_60,&local_90);
    *&(outVec->m_bottomVec).m_floats = bVar1.m_floats;
  }
  return;
}

Assistant:

void transformInverse(	const SpatialVectorType &inVec,
							SpatialVectorType &outVec,
							eOutputOperation outOp = None)
	{
		if(outOp == None)
		{
			outVec.m_topVec = m_rotMat.transpose() * inVec.m_topVec;
			outVec.m_bottomVec = m_rotMat.transpose() * (inVec.m_bottomVec + m_trnVec.cross(inVec.m_topVec));
		}
		else if(outOp == Add)
		{
			outVec.m_topVec += m_rotMat.transpose() * inVec.m_topVec;
			outVec.m_bottomVec += m_rotMat.transpose() * (inVec.m_bottomVec + m_trnVec.cross(inVec.m_topVec));
		}
		else if(outOp == Subtract)
		{
			outVec.m_topVec -= m_rotMat.transpose() * inVec.m_topVec;
			outVec.m_bottomVec -= m_rotMat.transpose() * (inVec.m_bottomVec + m_trnVec.cross(inVec.m_topVec));
		}			
	}